

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O0

void Eigen::internal::
     triangular_assignment_loop<Eigen::internal::triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1U,_-1,_true>
     ::run(triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  Index IVar1;
  long *plVar2;
  Index IVar3;
  long local_40;
  Index i;
  SrcEvaluatorType *local_30;
  Index maxi;
  Index j;
  triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *kernel_local;
  long *local_10;
  
  j = (Index)kernel;
  for (maxi = 0; IVar3 = maxi,
      IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
              ::cols((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                      *)j), IVar3 < IVar1; maxi = maxi + 1) {
    i = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
        ::rows((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                *)j);
    local_10 = &maxi;
    kernel_local = (triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    *)&i;
    plVar2 = std::min<long>(local_10,(long *)kernel_local);
    local_30 = (SrcEvaluatorType *)*plVar2;
    for (local_40 = 0; local_40 < (long)local_30; local_40 = local_40 + 1) {
      triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignOppositeCoeff
                ((triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                  *)j,local_40,maxi);
    }
    IVar3 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
            ::rows((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    *)j);
    if (local_40 < IVar3) {
      triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignDiagonalCoeff
                ((triangular_dense_assignment_kernel<1,_0,_1,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                  *)j,local_40);
      local_40 = local_40 + 1;
    }
    for (; IVar3 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   ::rows((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                           *)j), local_40 < IVar3; local_40 = local_40 + 1) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignCoeff((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)j,local_40,maxi);
    }
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(Kernel &kernel)
  {
    for(Index j = 0; j < kernel.cols(); ++j)
    {
      Index maxi = numext::mini(j, kernel.rows());
      Index i = 0;
      if (((Mode&Lower) && SetOpposite) || (Mode&Upper))
      {
        for(; i < maxi; ++i)
          if(Mode&Upper) kernel.assignCoeff(i, j);
          else           kernel.assignOppositeCoeff(i, j);
      }
      else
        i = maxi;
      
      if(i<kernel.rows()) // then i==j
        kernel.assignDiagonalCoeff(i++);
      
      if (((Mode&Upper) && SetOpposite) || (Mode&Lower))
      {
        for(; i < kernel.rows(); ++i)
          if(Mode&Lower) kernel.assignCoeff(i, j);
          else           kernel.assignOppositeCoeff(i, j);
      }
    }
  }